

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

void * lace_worker_thread(void *arg)

{
  uint uVar1;
  Worker **ppWVar2;
  uint uVar3;
  atomic<unsigned_int> aVar4;
  WorkerP *self_00;
  Task *__dq_head;
  Worker **ppWVar5;
  Task *__lace_dq_head;
  WorkerP *__lace_worker;
  uint uStack_70;
  int worker;
  void *arg_local;
  Worker *res;
  int i;
  uint n;
  atomic<unsigned_int> seed;
  Worker **victim;
  Worker **self;
  int worker_id;
  
  uStack_70 = (uint)arg;
  lace_init_worker(uStack_70);
  lace_pin_worker();
  sem_wait((sem_t *)&suspend_semaphore);
  LOCK();
  workers_running = workers_running + 1;
  UNLOCK();
  self_00 = lace_get_worker();
  __dq_head = lace_get_head(self_00);
  uVar1 = n_workers;
  uVar3 = (uint)self_00->worker;
  ppWVar5 = workers + (int)uVar3;
  res._4_4_ = 0;
  i = uVar3;
  _n = ppWVar5;
  while (lace_quits == 0) {
    if (1 < uVar1) {
      if ((int)res._4_4_ < 1) {
        res._4_4_ = (__int_type)rng((atomic<unsigned_int> *)&i,0x28);
        ppWVar2 = workers;
        aVar4 = rng((atomic<unsigned_int> *)&i,uVar1 - 1);
        _n = ppWVar2 + (ulong)((int)aVar4.super___atomic_base<unsigned_int>._M_i + uVar3 + 1) %
                       (ulong)uVar1;
      }
      else {
        res._4_4_ = res._4_4_ - 1;
        ppWVar2 = _n + 1;
        if (_n + 1 == ppWVar5) {
          ppWVar2 = _n + 2;
        }
        _n = ppWVar2;
        if (workers + uVar1 <= _n) {
          _n = workers;
        }
        if (_n == ppWVar5) {
          _n = _n + 1;
        }
      }
      lace_steal(self_00,__dq_head,*_n);
    }
    if (lace_newframe.t != (Task *)0x0) {
      lace_yield(self_00,__dq_head);
    }
    if (external_task != (ExtTask *)0x0) {
      lace_steal_external(self_00,__dq_head);
    }
    if (must_suspend != 0) {
      LOCK();
      workers_running = workers_running - 1;
      UNLOCK();
      sem_wait((sem_t *)&suspend_semaphore);
      lace_barrier();
      LOCK();
      workers_running = workers_running + 1;
      UNLOCK();
    }
  }
  LOCK();
  workers_running = workers_running - 1;
  UNLOCK();
  return (void *)0x0;
}

Assistant:

static void*
lace_worker_thread(void* arg)
{
    int worker = (int)(size_t)arg;

    // Initialize data structures
    lace_init_worker(worker);

    // Pin CPU
    lace_pin_worker();

    // Wait for the first time we are resumed
    sem_wait(&suspend_semaphore);

    // Signal that we are running
    workers_running += 1;

    // Run the steal loop
    WorkerP *__lace_worker = lace_get_worker();
    Task *__lace_dq_head = lace_get_head(__lace_worker);
    lace_steal_loop_WORK(__lace_worker, __lace_dq_head, &lace_quits);

    // Time worker exit event
    lace_time_event(__lace_worker, 9);

    // Signal that we stopped
    workers_running -= 1;

    return NULL;
}